

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O1

void __thiscall cppforth::Forth::memResize(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  Cell CVar2;
  pointer pVVar3;
  uint uVar4;
  uint Value;
  ulong uVar5;
  int __fd2;
  int __fd;
  uint x;
  ulong uVar6;
  ulong uVar7;
  
  requireDStackDepth(this,2,"RESIZE");
  this_00 = &this->dStack;
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  Value = ForthStack<unsigned_int>::getTop(this_00,1);
  if (uVar4 <= this->vmMaxSegmentSize) {
    pVVar3 = (this->VirtualMemory).
             super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
    uVar5 = (long)uVar6 >> 5;
    uVar6 = uVar6 | 8;
    do {
      uVar7 = uVar6;
      uVar5 = uVar5 - 1;
      if (uVar5 < 3) goto LAB_0011dbff;
      uVar1 = *(uint *)((long)pVVar3 + (uVar7 - 0x28));
      uVar6 = uVar7 - 0x20;
    } while (uVar1 != Value);
    CVar2 = *(Cell *)((long)&pVVar3[-2].segment.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + uVar7 + 0x14);
    x = CVar2 - uVar1;
    if (uVar4 <= x) {
      if (this->VirtualMemoryFreeSegment == CVar2) {
        this->VirtualMemoryFreeSegment = uVar1 + uVar4;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&pVVar3[-1].start + uVar7),(ulong)uVar4);
      pVVar3 = (this->VirtualMemory).
               super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(uint *)((long)&pVVar3[-2].segment.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
               uVar7 + 0x14) =
           *(int *)((long)&pVVar3[-2].segment.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + uVar7 + 0x10) + uVar4;
      ForthStack<unsigned_int>::setTop(this_00,0);
      ForthStack<unsigned_int>::setTop(this_00,1,Value);
      return;
    }
    memAllocate(this);
    uVar4 = ForthStack<unsigned_int>::getTop(this_00,0);
    if (uVar4 == 0) {
      __fd = 1;
      requireDStackDepth(this,1,"DROP");
      ForthStack<unsigned_int>::pop(this_00);
      dup2(this,__fd,__fd2);
      ForthStack<unsigned_int>::push(this_00,x);
      cMove(this);
      swap(this);
      memFree(this);
      uVar4 = 0;
      goto LAB_0011dc07;
    }
    ForthStack<unsigned_int>::pop(this_00);
  }
LAB_0011dbff:
  uVar4 = 0xffffffc3;
LAB_0011dc07:
  ForthStack<unsigned_int>::setTop(this_00,uVar4);
  return;
}

Assistant:

void memResize() {
			REQUIRE_DSTACK_DEPTH(2, "RESIZE");
			Cell size = dStack.getTop();
			auto addr = dStack.getTop(1);
			// find segment 
			if (size <= vmMaxSegmentSize){
				for (auto i = VirtualMemory.size() - 1; i > vmSegmentDataSpace; --i){
					if (VirtualMemory[i].start == addr){
						auto oldSize = (VirtualMemory[i].end - VirtualMemory[i].start);
						if ( oldSize >= size){
							if (VirtualMemoryFreeSegment == VirtualMemory[i].end){
								VirtualMemoryFreeSegment = VirtualMemory[i].start + size;
							}
							VirtualMemory[i].segment.resize(size);
							VirtualMemory[i].end = VirtualMemory[i].start + size;
							dStack.setTop(0);
							dStack.setTop(1, CELL(addr));
							return;
						}
						else {
							// ( addr size -- )
							// allocate new segment instead of current
							memAllocate();
							if (dStack.getTop(0) == 0){
								// (addr addrnew ior -- )
								drop();
								// (addr addrnew -- )
								dup2();
								// (addr addrnew addr addrnew -- )
								dStack.push(oldSize);
								// (addr addrnew addr addrnew u -- )
								cMove();
								// (addr addrnew -- )
								swap();
								// ( addrnew addr -- )
								memFree();
								// ( addrnew  ior(free) -- )
								dStack.setTop(0);
							}
							else {
								// (addr addrnew ior -- )
								pop();
								// (addr addrnew -- )
								dStack.setTop(CELL(errorResize));
								// (addr ior -- )
							}
							return;
						}
					}
				}
			}
			// did not found : ( addr size -- 0 -61 )
			dStack.setTop(static_cast<Cell>(errorResize));
				return;
		}